

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Identifier.h
# Opt level: O2

IdentifierPath * __thiscall
soul::IdentifierPath::operator+
          (IdentifierPath *__return_storage_ptr__,IdentifierPath *this,IdentifierPath *other)

{
  Identifier *pIVar1;
  size_t sVar2;
  long lVar3;
  
  ArrayWithPreallocation<soul::Identifier,_8UL>::ArrayWithPreallocation
            (&__return_storage_ptr__->pathSections,&this->pathSections);
  pIVar1 = (other->pathSections).items;
  sVar2 = (other->pathSections).numActive;
  for (lVar3 = 0; sVar2 << 3 != lVar3; lVar3 = lVar3 + 8) {
    addSuffix(__return_storage_ptr__,*(string **)((long)&pIVar1->name + lVar3));
  }
  return __return_storage_ptr__;
}

Assistant:

IdentifierPath operator+ (const IdentifierPath& other) const
    {
        IdentifierPath result (*this);

        for (auto i : other.pathSections)
            result.addSuffix (i);

        return result;
    }